

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::notify_new_savept(CVmObjTable *this)

{
  CVmObject *pCVar1;
  long in_RDI;
  vm_obj_id_t id;
  size_t j;
  size_t i;
  CVmObjPageEntry *entry;
  CVmObjPageEntry **pg;
  long local_28;
  long local_20;
  CVmObjPageEntry *local_18;
  undefined8 *local_10;
  
  local_10 = *(undefined8 **)(in_RDI + 0x18);
  for (local_20 = *(long *)(in_RDI + 0x28); local_20 != 0; local_20 = local_20 + -1) {
    local_28 = 0x1000;
    local_18 = (CVmObjPageEntry *)*local_10;
    for (; local_28 != 0; local_28 = local_28 + -1) {
      if ((*(ushort *)&local_18->field_0x14 & 1) == 0) {
        *(ushort *)&local_18->field_0x14 = *(ushort *)&local_18->field_0x14 & 0xffbf | 0x40;
        pCVar1 = CVmObjPageEntry::get_vm_obj(local_18);
        (*pCVar1->_vptr_CVmObject[0x13])();
      }
      local_18 = local_18 + 1;
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void CVmObjTable::notify_new_savept()
{
    CVmObjPageEntry **pg;
    CVmObjPageEntry *entry;
    size_t i;
    size_t j;
    vm_obj_id_t id;

    /* go through each page of objects */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* go through each entry on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; --j, ++entry, ++id)
        {
            /* if this entry is active, tell it about the new savepoint */
            if (!entry->free_)
            {
                /* 
                 *   the object existed at the start of this savepoint, so
                 *   it must keep undo information throughout the savepoint 
                 */
                entry->in_undo_ = TRUE;
                
                /* notify the object of the new savepoint */
                entry->get_vm_obj()->notify_new_savept();
            }
        }
    }
}